

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O3

bool __thiscall QGles2RenderBuffer::createFrom(QGles2RenderBuffer *this,NativeRenderBuffer src)

{
  QRhiGles2 *this_00;
  bool bVar1;
  int iVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QRhiResource *copy;
  bool local_31;
  QGles2RenderBuffer *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (src.object == 0) {
    bVar3 = false;
  }
  else {
    if (this->renderbuffer != 0) {
      (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
    }
    this_00 = (QRhiGles2 *)(this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi;
    iVar2 = QRhiImplementation::effectiveSampleCount
                      ((QRhiImplementation *)this_00,(this->super_QRhiRenderBuffer).m_sampleCount);
    this->samples = iVar2;
    if (((this->super_QRhiRenderBuffer).m_flags.super_QFlagsStorageHelper<QRhiRenderBuffer::Flag,_4>
         .super_QFlagsStorage<QRhiRenderBuffer::Flag>.i & 1) != 0) {
      createFrom();
    }
    bVar3 = false;
    bVar1 = QRhiGles2::ensureContext(this_00,(QSurface *)0x0);
    if (bVar1) {
      this->renderbuffer = (GLuint)src.object;
      this->owns = false;
      this->generation = this->generation + 1;
      local_31 = true;
      local_30 = this;
      QHash<QRhiResource*,bool>::emplace<bool_const&>
                ((QHash<QRhiResource*,bool> *)&(this_00->super_QRhiImplementation).resources,
                 (QRhiResource **)&local_30,&local_31);
      bVar3 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2RenderBuffer::createFrom(NativeRenderBuffer src)
{
    if (!src.object)
        return false;

    if (renderbuffer)
        destroy();

    QRHI_RES_RHI(QRhiGles2);
    samples = rhiD->effectiveSampleCount(m_sampleCount);

    if (m_flags.testFlag(UsedWithSwapChainOnly))
        qWarning("RenderBuffer: UsedWithSwapChainOnly is meaningless when importing an existing native object");

    if (!rhiD->ensureContext())
        return false;

    renderbuffer = src.object;

    owns = false;
    generation += 1;
    rhiD->registerResource(this);
    return true;
}